

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkState.cpp
# Opt level: O0

void __thiscall iDynTree::LinkInertias::LinkInertias(LinkInertias *this,size_t nrOfLinks)

{
  size_t in_stack_00000048;
  LinkInertias *in_stack_00000050;
  
  std::vector<iDynTree::SpatialInertia,_std::allocator<iDynTree::SpatialInertia>_>::vector
            ((vector<iDynTree::SpatialInertia,_std::allocator<iDynTree::SpatialInertia>_> *)0x437c9c
            );
  resize(in_stack_00000050,in_stack_00000048);
  return;
}

Assistant:

LinkInertias::LinkInertias(std::size_t nrOfLinks)
{
    this->resize(nrOfLinks);
}